

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

void __thiscall
QGraphicsTextItem::mouseDoubleClickEvent(QGraphicsTextItem *this,QGraphicsSceneMouseEvent *event)

{
  bool bVar1;
  QGraphicsItem *in_RSI;
  QGraphicsItem *in_RDI;
  QEvent *unaff_retaddr;
  
  if ((*(byte *)((long)in_RDI[2]._vptr_QGraphicsItem + 0x2c) & 1) == 0) {
    bVar1 = QGraphicsItem::hasFocus(in_RDI);
    if (bVar1) {
      QGraphicsTextItemPrivate::sendControlEvent((QGraphicsTextItemPrivate *)event,unaff_retaddr);
    }
    else {
      QGraphicsItem::mouseDoubleClickEvent(in_RSI,(QGraphicsSceneMouseEvent *)in_RDI);
    }
  }
  else {
    QGraphicsItem::mouseDoubleClickEvent(in_RSI,(QGraphicsSceneMouseEvent *)in_RDI);
  }
  return;
}

Assistant:

void QGraphicsTextItem::mouseDoubleClickEvent(QGraphicsSceneMouseEvent *event)
{
    if (dd->useDefaultImpl) {
        QGraphicsItem::mouseDoubleClickEvent(event);
        return;
    }

    if (!hasFocus()) {
        QGraphicsItem::mouseDoubleClickEvent(event);
        return;
    }

    dd->sendControlEvent(event);
}